

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O2

Face __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::removeInsertedVertex
          (SignpostIntrinsicTriangulation *this,Vertex v)

{
  Vertex v_00;
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> f;
  Edge e;
  Vertex v_local;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> local_98;
  undefined1 auVar6 [16];
  
  v_local.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
       = v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
         ind;
  v_local.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
  mesh = v.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
         mesh;
  if (((this->vertexLocations).data.
       super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
       .m_storage.m_data
       [v_local.
        super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind].
       type != Vertex) && (bVar1 = isOnFixedEdge(this,v), !bVar1)) {
    uVar4 = 0;
    do {
      sVar2 = Vertex::degree(&v_local);
      if (sVar2 == 3) {
        sVar2 = Vertex::degree(&v_local);
        if (sVar2 == 3) {
          v_00.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = v_local.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                 .ind;
          v_00.
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = v_local.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
          f = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
              ManifoldSurfaceMesh::removeVertex
                        ((this->intrinsicMesh)._M_t.
                         super___uniq_ptr_impl<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                         .
                         super__Head_base<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_false>
                         ._M_head_impl,v_00);
          updateFaceBasis(this,(Face)f);
          auVar5._0_8_ = f.mesh;
          auVar5._8_8_ = f.ind;
          return (Face)auVar5;
        }
        break;
      }
      Vertex::adjacentEdges(&local_98,&v_local);
      NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::begin
                (&__begin3,&local_98);
      __end3.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = local_98.cachedEndIter.state.currE.firstHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
      __end3.state.currE.firstHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           local_98.cachedEndIter.state.currE.firstHe.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
      __end3.justStarted = local_98.cachedEndIter.justStarted;
      __end3._49_7_ = local_98.cachedEndIter._49_7_;
      __end3.state.currE.useImplicitTwin = local_98.cachedEndIter.state.currE.useImplicitTwin;
      __end3.state.currE._1_7_ = local_98.cachedEndIter.state.currE._1_7_;
      __end3.state.currE.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = local_98.cachedEndIter.state.currE.currHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
      __end3.state.currE.currHe.
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           local_98.cachedEndIter.state.currE.currHe.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           ind;
      __end3.state.currE.processingIncoming = local_98.cachedEndIter.state.currE.processingIncoming;
      __end3.state.currE._25_7_ = local_98.cachedEndIter.state.currE._25_7_;
      while( true ) {
        bVar1 = NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::
                operator!=(&__begin3,&__end3);
        if (!bVar1) {
          auVar6._0_8_ = SUB168(ZEXT816(0xffffffffffffffff) << 0x40,0);
          auVar6._8_8_ = SUB168(ZEXT816(0xffffffffffffffff) << 0x40,8);
          return (Face)auVar6;
        }
        if ((__begin3.state.currE.currHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->useImplicitTwinFlag == true) {
          uVar3 = __begin3.state.currE.currHe.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind >> 1;
        }
        else {
          uVar3 = ((__begin3.state.currE.currHe.
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .mesh)->heEdgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [__begin3.state.currE.currHe.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind];
        }
        e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
             uVar3;
        e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
             = __begin3.state.currE.currHe.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh;
        bVar1 = flipEdgeIfPossible(this,e,1e-06);
        if (bVar1) break;
        NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::operator++
                  (&__begin3);
      }
      sVar2 = Vertex::degree(&v_local);
      bVar1 = uVar4 <= sVar2 * 10;
      uVar4 = uVar4 + 1;
    } while (bVar1);
  }
  return (Face)(Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               (ZEXT816(0xffffffffffffffff) << 0x40);
}

Assistant:

Face SignpostIntrinsicTriangulation::removeInsertedVertex(Vertex v) {
  // Strategy: flip edges until the vertex has degree three, then remove by replacing with a single face
  // TODO needs a proof that this always works... what about self edges, etc? Seems to work well.

  // What about starting with degree < 3? Since this vertex necessarily has angle sum 2PI, this could only happen in the
  // case of degree 2, with exactly degenerate triangles. Since we assume non-degenerate triangles throughout, we'll
  // consider that to not happen.

  if (vertexLocations[v].type == SurfacePointType::Vertex) return Face(); // can't remove original vertices

  if (isOnFixedEdge(v)) {
    return Face(); // don't try to remove boundary vertices, for now at least
  }

  // Flip edges until
  size_t iterCount = 0;
  while (v.degree() != 3) {

    // Find any edge we can flip
    bool anyFlipped = false;
    for (Edge e : v.adjacentEdges()) {
      anyFlipped = flipEdgeIfPossible(e);
      if (anyFlipped) break;
    }

    // failsafe, in case we get numerically stuck, or there are too many fixed edges (or the algorithm is broken)
    if (!anyFlipped || iterCount > 10 * v.degree()) {
      return Face();
    }

    iterCount++;
  }

  // give up if something went wrong (eg. flipped edges)
  if (v.degree() != 3) return Face();

  // Remove the vertex
  Face newF = intrinsicMesh->removeVertex(v);
  updateFaceBasis(newF);
  return newF;
}